

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDifference.cpp
# Opt level: O0

void __thiscall OpenMD::CountDifference::doFrame(CountDifference *this,int param_2)

{
  bool bVar1;
  long in_RDI;
  RealType c2;
  RealType c1;
  uint count2;
  uint count1;
  int i;
  StuntDouble *sd;
  value_type_conflict *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  SelectionSet *in_stack_ffffffffffffff68;
  SelectionManager *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<double,_std::allocator<double>_> local_60;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x120));
  if (bVar1) {
    in_stack_ffffffffffffff68 = (SelectionSet *)(in_RDI + 0x38);
    in_stack_ffffffffffffff70 = (SelectionManager *)&stack0xffffffffffffffc8;
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    SelectionManager::setSelectionSet(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    SelectionSet::~SelectionSet((SelectionSet *)0x123827);
  }
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x758));
  if (bVar1) {
    in_stack_ffffffffffffff58 = (value_type_conflict *)(in_RDI + 0x670);
    in_stack_ffffffffffffff60 = &local_60;
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    SelectionManager::setSelectionSet(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    SelectionSet::~SelectionSet((SelectionSet *)0x12389f);
  }
  SelectionManager::getSelectionCount((SelectionManager *)0x1238c9);
  SelectionManager::getSelectionCount((SelectionManager *)0x1238de);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void CountDifference::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    if (evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    unsigned int count1 = seleMan1_.getSelectionCount();
    unsigned int count2 = seleMan2_.getSelectionCount();
        
    RealType c1 = count1;
    RealType c2 = count2;
  
    values_.push_back(c2 - c1);
  }